

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O1

int __thiscall ProcessesView::getRowIndexByPid(ProcessesView *this,QString *pid)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  int iVar6;
  bool bVar7;
  QStringView QVar8;
  QStringView QVar9;
  QString row_pid;
  QArrayData *local_98;
  storage_type_conflict *local_90;
  long local_88;
  anon_union_24_3_e3d07ef4_for_data local_80;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [24];
  
  plVar4 = (long *)QAbstractItemView::model();
  local_80._forAlignment = -NAN;
  local_80._8_8_ = 0;
  local_80._16_8_ = 0;
  iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
  iVar6 = -1;
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      plVar4 = (long *)QAbstractItemView::model();
      plVar5 = (long *)QAbstractItemView::model();
      local_60 = 0xffffffffffffffff;
      local_58 = 0;
      uStack_50 = 0;
      (**(code **)(*plVar5 + 0x60))(local_48,plVar5,iVar2,3,&local_60);
      (**(code **)(*plVar4 + 0x90))(&local_80,plVar4,local_48,0);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&local_80);
      lVar1 = (pid->d).size;
      if (local_88 == lVar1) {
        QVar8.m_data = local_90;
        QVar8.m_size = local_88;
        QVar9.m_data = (pid->d).ptr;
        QVar9.m_size = lVar1;
        iVar3 = QtPrivate::compareStrings(QVar8,QVar9,CaseSensitive);
        bVar7 = iVar3 == 0;
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
        iVar6 = iVar2;
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,2,8);
        }
      }
      if (bVar7) {
        return iVar6;
      }
      iVar2 = iVar2 + 1;
      plVar4 = (long *)QAbstractItemView::model();
      local_80._forAlignment = -NAN;
      local_80._8_8_ = 0;
      local_80._16_8_ = 0;
      iVar3 = (**(code **)(*plVar4 + 0x78))(plVar4,&local_80);
    } while (iVar2 < iVar3);
  }
  return -1;
}

Assistant:

int ProcessesView::getRowIndexByPid(const QString &pid) {
    for (int i = 0; i < model()->rowCount(); i++) {
        QString row_pid = model()->data(model()->index(i, NVSMColumns::PID)).toString();

        if (row_pid == pid) {
            return i;
        }
    }

    return -1;
}